

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O1

void __thiscall FArchive::WriteString(FArchive *this,char *str)

{
  bool bVar1;
  ulong in_RAX;
  size_t sVar2;
  _func_int **pp_Var3;
  ulong uVar4;
  uint uVar5;
  undefined8 uStack_38;
  
  if (str == (char *)0x0) {
    str = (char *)((long)&uStack_38 + 7);
    uStack_38 = in_RAX & 0xffffffffffffff;
    pp_Var3 = this->_vptr_FArchive;
    uVar4 = 1;
  }
  else {
    uStack_38 = in_RAX;
    sVar2 = strlen(str);
    uVar5 = (int)sVar2 + 1;
    do {
      uStack_38._0_7_ = CONCAT16((0x7f < uVar5) << 7 | (byte)uVar5 & 0x7f,(undefined6)uStack_38);
      (*this->_vptr_FArchive[2])(this,(long)&uStack_38 + 6,1);
      bVar1 = 0x7f < uVar5;
      uVar5 = uVar5 >> 7;
    } while (bVar1);
    pp_Var3 = this->_vptr_FArchive;
    uVar4 = sVar2 & 0xffffffff;
  }
  (*pp_Var3[2])(this,str,uVar4);
  return;
}

Assistant:

void FArchive::WriteString (const char *str)
{
	if (str == NULL)
	{
		WriteCount (0);
	}
	else
	{
		DWORD size = (DWORD)(strlen (str) + 1);
		WriteCount (size);
		Write (str, size - 1);
	}
}